

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

EulerAngles * AML::quat2EulerAngles_YZX(EulerAngles *__return_storage_ptr__,Quaternion *quat)

{
  double phi_;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_48;
  
  dVar1 = (quat->field_0).data[0];
  dVar2 = (quat->field_0).data[1];
  dVar3 = (quat->field_0).data[2];
  dVar4 = (quat->field_0).data[3];
  dVar5 = dVar1 + dVar1;
  phi_ = atan2((dVar2 + dVar2) * dVar4 + dVar5 * dVar3,
               ((dVar1 * dVar1 + dVar2 * dVar2) - dVar3 * dVar3) - dVar4 * dVar4);
  local_48 = asin((dVar2 + dVar2) * dVar3 - dVar5 * dVar4);
  local_48 = -local_48;
  dVar1 = atan2(dVar2 * dVar5 + (dVar3 + dVar3) * dVar4,
                ((dVar1 * dVar1 - dVar2 * dVar2) + dVar3 * dVar3) - dVar4 * dVar4);
  EulerAngles::EulerAngles(__return_storage_ptr__,phi_,local_48,dVar1,YZX);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles quat2EulerAngles_YZX(const Quaternion& quat)
    {
        const double q0_2 = quat.q0 * quat.q0;
        const double q1_2 = quat.q1 * quat.q1;
        const double q2_2 = quat.q2 * quat.q2;
        const double q3_2 = quat.q3 * quat.q3;
        const double x2q1q2 = 2.0 * quat.q1 * quat.q2;
        const double x2q0q3 = 2.0 * quat.q0 * quat.q3;
        const double x2q1q3 = 2.0 * quat.q1 * quat.q3;
        const double x2q0q2 = 2.0 * quat.q0 * quat.q2;
        const double x2q2q3 = 2.0 * quat.q2 * quat.q3;
        const double x2q0q1 = 2.0 * quat.q0 * quat.q1;
        const double m11 = q0_2 + q1_2 - q2_2 - q3_2;
        const double m21 = x2q1q2 - x2q0q3;
        const double m22 = q0_2 - q1_2 + q2_2 - q3_2;
        const double m23 = x2q2q3 + x2q0q1;
        const double m31 = x2q1q3 + x2q0q2;
        const double phi = atan2(m31, m11);
        const double theta = -asin(m21);
        const double psi = atan2(m23, m22);
        return EulerAngles(phi, theta, psi, EulerAngles::EulerSequence::YZX);
    }